

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall CompressedXipReader::loadmemrd(CompressedXipReader *this)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  ByteVectorReader *__p;
  shared_ptr<MemoryReader> memrd;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  shared_ptr<MemoryReader> local_28;
  
  __p = (ByteVectorReader *)operator_new(0x40);
  *(undefined2 *)&(__p->super_MemoryReader).super_ReadWriter._readonly = 0x100;
  (__p->super_MemoryReader)._mem = (uint8_t *)0x0;
  (__p->super_MemoryReader)._size = 0;
  (__p->super_MemoryReader)._curpos = 0;
  (__p->super_MemoryReader).super_ReadWriter._vptr_ReadWriter =
       (_func_int **)&PTR__ByteVectorReader_00146950;
  (__p->_bv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->_bv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->_bv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ByteVectorReader*>(&local_30,__p);
  uVar1 = this->_pos;
  (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this,0);
  local_28.super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_30._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
  }
  local_28.super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)__p
  ;
  ReadWriter::copyto<std::shared_ptr<MemoryReader>>(&this->super_ReadWriter,&local_28);
  if (local_28.super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_30);
  (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this,(ulong)uVar1);
  puVar2 = (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (this->_compptrs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->_compptrs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->_compptrs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar3 = (this->_cache).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_cache).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->_cache).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  this->_cachepos = 0;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return;
}

Assistant:

void loadmemrd()
    {
        std::shared_ptr<MemoryReader> memrd(new ByteVectorReader());
        uint64_t savedpos= _pos;

        setpos(0);
        copyto(memrd);

        // from now on all read/writes are done via memrd
        _memrd= memrd;
        setpos(savedpos);

        // discard ptrs into live image
        _compsizes.clear();
        _compptrs.clear();
        _cache.clear();
        _cachepos= 0;
    }